

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handshake_client.cc
# Opt level: O0

ssl_hs_wait_t bssl::do_read_server_hello(SSL_HANDSHAKE *hs)

{
  SSL *ssl_00;
  SSL3_STATE *pSVar1;
  SSL_CIPHER *pSVar2;
  Span<const_unsigned_char> traffic_secret;
  Span<const_unsigned_char> traffic_secret_00;
  bool bVar3;
  uint16_t uVar4;
  SSLSessionType SVar5;
  int iVar6;
  uint8_t *src;
  size_t sVar7;
  pointer psVar8;
  pointer psVar9;
  EVP_MD *md;
  undefined4 extraout_var;
  SSLExtension *contents;
  undefined1 in_R9B;
  Span<const_unsigned_char> in;
  undefined1 in_stack_fffffffffffffdb8 [15];
  undefined1 in_stack_fffffffffffffdc7;
  byte local_1ca;
  byte local_1c9;
  bool local_1b9;
  SSL_SESSION *local_1b8 [2];
  SSL_SESSION *local_1a8 [2];
  SSL_HANDSHAKE *local_198;
  uchar *local_190;
  undefined4 local_188;
  undefined1 local_178 [8];
  Array<unsigned_char> shared_secret;
  Span<const_unsigned_char> local_158;
  size_t local_148;
  size_t hash_len;
  uint16_t local_132;
  size_t *psStack_130;
  uint16_t version;
  size_t *local_128;
  undefined1 *local_120;
  size_t *local_118;
  uint8_t *local_110;
  undefined8 local_108;
  undefined1 local_100 [8];
  SSLExtension supported_versions;
  SSLExtension pre_shared_key;
  SSLExtension pake_share;
  SSLExtension key_share;
  undefined1 local_98 [5];
  bool pre_shared_key_allowed;
  bool ech_accepted;
  uint8_t alert;
  ParsedServerHello server_hello;
  SSLMessage msg;
  SSL *ssl;
  SSL_HANDSHAKE *hs_local;
  
  ssl_00 = hs->ssl;
  bVar3 = (*ssl_00->method->get_message)(ssl_00,(SSLMessage *)&server_hello.extensions.len);
  if (!bVar3) {
    return ssl_hs_read_message;
  }
  ParsedServerHello::ParsedServerHello((ParsedServerHello *)local_98);
  key_share.data.len._7_1_ = 0x32;
  bVar3 = parse_server_hello_tls13
                    (hs,(ParsedServerHello *)local_98,(uint8_t *)((long)&key_share.data.len + 7),
                     (SSLMessage *)&server_hello.extensions.len);
  if (!bVar3) {
    ssl_send_alert(ssl_00,2,(uint)key_share.data.len._7_1_);
    return ssl_hs_error;
  }
  bVar3 = is_hello_retry_request((ParsedServerHello *)local_98);
  if (bVar3) {
    ssl_send_alert(ssl_00,2,10);
    ERR_put_error(0x10,0,0xdf,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_client.cc"
                  ,0x183);
    return ssl_hs_error;
  }
  uVar4 = SSL_CIPHER_get_protocol_id(hs->new_cipher);
  if (uVar4 != (uint16_t)server_hello.session_id.len) {
    ERR_put_error(0x10,0,0xf2,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_client.cc"
                  ,0x189);
    ssl_send_alert(ssl_00,2,0x2f);
    return ssl_hs_error;
  }
  if (ssl_00->s3->ech_status == ssl_ech_accepted) {
    if ((*(ushort *)&ssl_00->s3->field_0xdc >> 0xc & 1) != 0) {
      bVar3 = check_ech_confirmation
                        (hs,(bool *)((long)&key_share.data.len + 6),
                         (uint8_t *)((long)&key_share.data.len + 7),(ParsedServerHello *)local_98);
      if (!bVar3) {
        ssl_send_alert(ssl_00,2,(uint)key_share.data.len._7_1_);
        return ssl_hs_error;
      }
      if ((key_share.data.len._6_1_ & 1) == 0) {
        ERR_put_error(0x10,0,0x141,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_client.cc"
                      ,0x197);
        ssl_send_alert(ssl_00,2,0x2f);
        return ssl_hs_error;
      }
    }
    SSLTranscript::operator=(&hs->transcript,&hs->inner_transcript);
    hs->extensions = (anon_union_4_2_c8db58f8_for_extensions)hs->inner_extensions_sent;
    ::OPENSSL_memcpy(ssl_00->s3->client_random,hs->inner_client_random,0x20);
  }
  pSVar1 = ssl_00->s3;
  src = CBS_data((CBS *)&server_hello.legacy_version);
  ::OPENSSL_memcpy(pSVar1->server_random,src,0x20);
  bVar3 = std::operator!=(&ssl_00->session,(nullptr_t)0x0);
  local_1b9 = false;
  if (bVar3) {
    psVar8 = std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::get(&ssl_00->session);
    SVar5 = ssl_session_get_type(psVar8);
    local_1b9 = false;
    if (SVar5 == kPreSharedKey) {
      local_1b9 = ssl_00->s3->ech_status != ssl_ech_rejected;
    }
  }
  key_share.data.len._5_1_ = local_1b9;
  bVar3 = std::operator!=(hs->key_shares,(nullptr_t)0x0);
  SSLExtension::SSLExtension((SSLExtension *)&pake_share.data.len,0x33,bVar3);
  bVar3 = std::operator!=(&hs->pake_prover,(nullptr_t)0x0);
  SSLExtension::SSLExtension((SSLExtension *)&pre_shared_key.data.len,0x8a3b,bVar3);
  SSLExtension::SSLExtension
            ((SSLExtension *)&supported_versions.data.len,0x29,(bool)(key_share.data.len._5_1_ & 1))
  ;
  SSLExtension::SSLExtension((SSLExtension *)local_100,0x2b,true);
  psStack_130 = &pake_share.data.len;
  local_128 = &supported_versions.data.len;
  local_120 = local_100;
  local_118 = &pre_shared_key.data.len;
  local_110 = (uint8_t *)&stack0xfffffffffffffed0;
  local_108 = 4;
  bVar3 = ssl_parse_extensions
                    ((bssl *)&server_hello.cipher_suite,(CBS *)((long)&key_share.data.len + 7),
                     local_110,(initializer_list<bssl::SSLExtension_*>)ZEXT816(4),(bool)in_R9B);
  if (((bVar3 ^ 0xffU) & 1) != 0) {
    ssl_send_alert(ssl_00,2,(uint)key_share.data.len._7_1_);
    return ssl_hs_error;
  }
  if (((((local_100[3] & 1U) == 0) ||
       (iVar6 = CBS_get_u16((CBS *)&supported_versions,&local_132), iVar6 == 0)) ||
      (sVar7 = CBS_len((CBS *)&supported_versions), sVar7 != 0)) ||
     (local_132 != ssl_00->s3->version)) {
    ERR_put_error(0x10,0,0x120,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_client.cc"
                  ,0x1bf);
    ssl_send_alert(ssl_00,2,0x2f);
    return ssl_hs_error;
  }
  if (((pre_shared_key.data.len._3_1_ & 1) != 0) &&
     (((pake_share.data.len._3_1_ & 1) != 0 || ((supported_versions.data.len._3_1_ & 1) != 0)))) {
    ERR_put_error(0x10,0,0xde,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_client.cc"
                  ,0x1c9);
    ssl_send_alert(ssl_00,2,0x6e);
    return ssl_hs_error;
  }
  bVar3 = std::operator!=(&hs->pake_prover,(nullptr_t)0x0);
  if ((bVar3) && ((pre_shared_key.data.len._3_1_ & 1) == 0)) {
    ERR_put_error(0x10,0,0xa4,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_client.cc"
                  ,0x1cf);
    ssl_send_alert(ssl_00,2,0x6d);
    return ssl_hs_error;
  }
  bVar3 = std::operator==(&hs->pake_prover,(nullptr_t)0x0);
  if ((bVar3) && ((pake_share.data.len._3_1_ & 1) == 0)) {
    ERR_put_error(0x10,0,0x102,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_client.cc"
                  ,0x1d6);
    ssl_send_alert(ssl_00,2,0x6d);
    return ssl_hs_error;
  }
  if (((((pake_share.data.len._3_1_ & 1) == 0) || ((pre_shared_key.data.len._3_1_ & 1) != 0)) ||
      (local_1c9 = 1, (supported_versions.data.len._3_1_ & 1) != 0)) &&
     ((((pake_share.data.len._3_1_ & 1) == 0 || ((pre_shared_key.data.len._3_1_ & 1) != 0)) ||
      (local_1c9 = 1, (supported_versions.data.len._3_1_ & 1) == 0)))) {
    local_1ca = 0;
    if (((pake_share.data.len._3_1_ & 1) == 0) &&
       (local_1ca = 0, (pre_shared_key.data.len._3_1_ & 1) != 0)) {
      local_1ca = supported_versions.data.len._3_1_ ^ 0xff;
    }
    local_1c9 = local_1ca;
  }
  if ((local_1c9 & 1) == 0) {
    __assert_fail("(key_share.present && !pake_share.present && !pre_shared_key.present) || (key_share.present && !pake_share.present && pre_shared_key.present) || (!key_share.present && pake_share.present && !pre_shared_key.present)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_client.cc"
                  ,0x1e3,"enum ssl_hs_wait_t bssl::do_read_server_hello(SSL_HANDSHAKE *)");
  }
  key_share.data.len._7_1_ = 0x32;
  if ((supported_versions.data.len._3_1_ & 1) == 0) {
    bVar3 = ssl_get_new_session(hs);
    if (!bVar3) {
      ssl_send_alert(ssl_00,2,0x50);
      return ssl_hs_error;
    }
  }
  else {
    bVar3 = ssl_ext_pre_shared_key_parse_serverhello
                      (hs,(uint8_t *)((long)&key_share.data.len + 7),(CBS *)&pre_shared_key);
    if (!bVar3) {
      ssl_send_alert(ssl_00,2,(uint)key_share.data.len._7_1_);
      return ssl_hs_error;
    }
    psVar8 = std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::operator->(&ssl_00->session);
    if (psVar8->ssl_version != ssl_00->s3->version) {
      ERR_put_error(0x10,0,0xbc,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_client.cc"
                    ,0x1ee);
      ssl_send_alert(ssl_00,2,0x2f);
      return ssl_hs_error;
    }
    psVar8 = std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::operator->(&ssl_00->session);
    if (psVar8->cipher->algorithm_prf != hs->new_cipher->algorithm_prf) {
      ERR_put_error(0x10,0,0x10c,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_client.cc"
                    ,500);
      ssl_send_alert(ssl_00,2,0x2f);
      return ssl_hs_error;
    }
    psVar8 = std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::get(&ssl_00->session);
    bVar3 = ssl_session_is_context_valid(hs,psVar8);
    if (!bVar3) {
      ERR_put_error(0x10,0,0x65,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_client.cc"
                    ,0x1fc);
      ssl_send_alert(ssl_00,2,0x2f);
      return ssl_hs_error;
    }
    *(ushort *)&ssl_00->s3->field_0xdc = *(ushort *)&ssl_00->s3->field_0xdc & 0xffdf | 0x20;
    *(uint *)&hs->field_0x6c8 = *(uint *)&hs->field_0x6c8 & 0xff7fffff | 0x800000;
    psVar8 = std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::get(&ssl_00->session);
    SSL_SESSION_dup((bssl *)&hash_len,psVar8,0);
    std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::operator=
              (&hs->new_session,(unique_ptr<ssl_session_st,_bssl::internal::Deleter> *)&hash_len);
    std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::~unique_ptr
              ((unique_ptr<ssl_session_st,_bssl::internal::Deleter> *)&hash_len);
    bVar3 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&hs->new_session);
    if (!bVar3) {
      ssl_send_alert(ssl_00,2,0x50);
      return ssl_hs_error;
    }
    ssl_set_session(ssl_00,(SSL_SESSION *)0x0);
    psVar8 = std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::get(&hs->new_session);
    psVar9 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::operator->(&ssl_00->session_ctx);
    ssl_session_renew_timeout(ssl_00,psVar8,psVar9->session_psk_dhe_timeout);
  }
  pSVar2 = hs->new_cipher;
  psVar8 = std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::operator->(&hs->new_session);
  psVar8->cipher = pSVar2;
  uVar4 = ssl_protocol_version(ssl_00);
  md = (EVP_MD *)ssl_get_handshake_digest(uVar4,hs->new_cipher);
  iVar6 = EVP_MD_size(md);
  local_148 = CONCAT44(extraout_var,iVar6);
  if ((*(ushort *)&ssl_00->s3->field_0xdc >> 5 & 1) == 0) {
    Span<const_unsigned_char>::Span(&local_158,kZeroes,local_148);
  }
  else {
    psVar8 = std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::operator->(&hs->new_session);
    Span<unsigned_char>::
    Span<bssl::InplaceVector<unsigned_char,64ul>,void,bssl::InplaceVector<unsigned_char,64ul>>
              ((Span<unsigned_char> *)&shared_secret.size_,&psVar8->secret);
    Span<unsigned_char_const>::Span<bssl::Span<unsigned_char>,void,bssl::Span<unsigned_char>>
              ((Span<unsigned_char_const> *)&local_158,(Span<unsigned_char> *)&shared_secret.size_);
  }
  bVar3 = tls13_init_key_schedule(hs,local_158);
  if (((bVar3 ^ 0xffU) & 1) != 0) {
    return ssl_hs_error;
  }
  Array<unsigned_char>::Array((Array<unsigned_char> *)local_178);
  key_share.data.len._7_1_ = 0x32;
  if ((pake_share.data.len._3_1_ & 1) == 0) {
    if ((pre_shared_key.data.len._3_1_ & 1) == 0) {
      ERR_put_error(0x10,0,0x44,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_client.cc"
                    ,0x22f);
      ssl_send_alert(ssl_00,2,0x50);
      hs_local._4_4_ = ssl_hs_error;
      goto LAB_001c58b5;
    }
    contents = &pake_share;
    bVar3 = ssl_ext_pake_parse_serverhello
                      (hs,(Array<unsigned_char> *)local_178,
                       (uint8_t *)((long)&key_share.data.len + 7),(CBS *)contents);
    if (!bVar3) {
      ssl_send_alert(ssl_00,2,(uint)key_share.data.len._7_1_);
      hs_local._4_4_ = ssl_hs_error;
      goto LAB_001c58b5;
    }
  }
  else {
    contents = &key_share;
    bVar3 = ssl_ext_key_share_parse_serverhello
                      (hs,(Array<unsigned_char> *)local_178,
                       (uint8_t *)((long)&key_share.data.len + 7),(CBS *)contents);
    if (!bVar3) {
      ssl_send_alert(ssl_00,2,(uint)key_share.data.len._7_1_);
      hs_local._4_4_ = ssl_hs_error;
      goto LAB_001c58b5;
    }
  }
  Span<unsigned_char_const>::Span<bssl::Array<unsigned_char>,void,bssl::Array<unsigned_char>>
            ((Span<unsigned_char_const> *)&local_198,(Array<unsigned_char> *)local_178);
  in.size_ = (size_t)contents;
  in.data_ = local_190;
  bVar3 = tls13_advance_key_schedule((bssl *)hs,local_198,in);
  if (((bVar3) && (bVar3 = ssl_hash_message(hs,(SSLMessage *)&server_hello.extensions.len), bVar3))
     && (bVar3 = tls13_derive_handshake_secrets(hs), bVar3)) {
    if (((*(uint *)&hs->field_0x6c8 >> 10 & 1) == 0) || (iVar6 = SSL_is_quic(ssl_00), iVar6 != 0)) {
      psVar8 = std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::get(&hs->new_session);
      Span<unsigned_char_const>::
      Span<bssl::InplaceVector<unsigned_char,64ul>,void,bssl::InplaceVector<unsigned_char,64ul>>
                ((Span<unsigned_char_const> *)local_1a8,&hs->client_handshake_secret);
      traffic_secret.size_._7_1_ = in_stack_fffffffffffffdc7;
      traffic_secret._0_15_ = in_stack_fffffffffffffdb8;
      bVar3 = tls13_set_traffic_key
                        ((bssl *)ssl_00,(SSL *)0x2,ssl_encryption_early_data,
                         (evp_aead_direction_t)psVar8,local_1a8[0],traffic_secret);
      if (!bVar3) {
        hs_local._4_4_ = ssl_hs_error;
        goto LAB_001c58b5;
      }
    }
    psVar8 = std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::get(&hs->new_session);
    Span<unsigned_char_const>::
    Span<bssl::InplaceVector<unsigned_char,64ul>,void,bssl::InplaceVector<unsigned_char,64ul>>
              ((Span<unsigned_char_const> *)local_1b8,&hs->server_handshake_secret);
    traffic_secret_00.size_._7_1_ = in_stack_fffffffffffffdc7;
    traffic_secret_00._0_15_ = in_stack_fffffffffffffdb8;
    bVar3 = tls13_set_traffic_key
                      ((bssl *)ssl_00,(SSL *)0x2,ssl_encryption_initial,(evp_aead_direction_t)psVar8
                       ,local_1b8[0],traffic_secret_00);
    if (bVar3) {
      (*ssl_00->method->next_message)(ssl_00);
      hs->tls13_state = 3;
      hs_local._4_4_ = ssl_hs_ok;
    }
    else {
      hs_local._4_4_ = ssl_hs_error;
    }
  }
  else {
    hs_local._4_4_ = ssl_hs_error;
  }
LAB_001c58b5:
  local_188 = 1;
  Array<unsigned_char>::~Array((Array<unsigned_char> *)local_178);
  return hs_local._4_4_;
}

Assistant:

static enum ssl_hs_wait_t do_read_server_hello(SSL_HANDSHAKE *hs) {
  SSL *const ssl = hs->ssl;
  SSLMessage msg;
  if (!ssl->method->get_message(ssl, &msg)) {
    return ssl_hs_read_server_hello;
  }

  if (SSL_is_dtls(ssl) && !hs->received_hello_verify_request &&
      msg.type == DTLS1_MT_HELLO_VERIFY_REQUEST) {
    if (!handle_hello_verify_request(hs, msg)) {
      return ssl_hs_error;
    }
    hs->received_hello_verify_request = true;
    hs->state = state_read_server_hello;
    return ssl_hs_flush;
  }

  ParsedServerHello server_hello;
  uint16_t server_version;
  uint8_t alert = SSL_AD_DECODE_ERROR;
  if (!ssl_parse_server_hello(&server_hello, &alert, msg) ||
      !parse_server_version(hs, &server_version, &alert, server_hello)) {
    ssl_send_alert(ssl, SSL3_AL_FATAL, alert);
    return ssl_hs_error;
  }

  if (!ssl_supports_version(hs, server_version)) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_UNSUPPORTED_PROTOCOL);
    ssl_send_alert(ssl, SSL3_AL_FATAL, SSL_AD_PROTOCOL_VERSION);
    return ssl_hs_error;
  }

  if (!ssl->s3->initial_handshake_complete) {
    // |ssl->s3->version| may be set due to 0-RTT. If it was to a different
    // value, the check below will fire.
    assert(ssl->s3->version == 0 ||
           (hs->is_early_version &&
            ssl->s3->version == hs->early_session->ssl_version));
    ssl->s3->version = server_version;
    hs->is_early_version = false;
  } else if (server_version != ssl->s3->version) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_WRONG_SSL_VERSION);
    ssl_send_alert(ssl, SSL3_AL_FATAL, SSL_AD_PROTOCOL_VERSION);
    return ssl_hs_error;
  }

  // If the version did not match, stop sending 0-RTT data.
  if (hs->early_data_offered &&
      ssl->s3->version != hs->early_session->ssl_version) {
    // This is currently only possible by reading a TLS 1.2 (or earlier)
    // ServerHello in response to TLS 1.3. If there is ever a TLS 1.4, or
    // another variant of TLS 1.3, the fatal error below will need to be a clean
    // 0-RTT reject.
    assert(ssl_protocol_version(ssl) < TLS1_3_VERSION);
    assert(ssl_session_protocol_version(hs->early_session.get()) >=
           TLS1_3_VERSION);

    // A TLS 1.2 server would not know to skip the early data we offered, so
    // there is no point in continuing the handshake. Report an error code as
    // soon as we detect this. The caller may use this error code to implement
    // the fallback described in RFC 8446 appendix D.3.
    //
    // Disconnect early writes. This ensures subsequent |SSL_write| calls query
    // the handshake which, in turn, will replay the error code rather than fail
    // at the |write_shutdown| check. See https://crbug.com/1078515.
    // TODO(davidben): Should all handshake errors do this? What about record
    // decryption failures?
    //
    // TODO(crbug.com/381113363): Although missing from the spec, a DTLS 1.2
    // server will already naturally skip 0-RTT data. If we implement DTLS 1.3
    // 0-RTT, we may want a clean reject.
    assert(!SSL_is_dtls(ssl));
    hs->can_early_write = false;
    OPENSSL_PUT_ERROR(SSL, SSL_R_WRONG_VERSION_ON_EARLY_DATA);
    ssl_send_alert(ssl, SSL3_AL_FATAL, SSL_AD_PROTOCOL_VERSION);
    return ssl_hs_error;
  }

  if (ssl_protocol_version(ssl) >= TLS1_3_VERSION) {
    if (hs->received_hello_verify_request) {
      OPENSSL_PUT_ERROR(SSL, SSL_R_INVALID_MESSAGE);
      ssl_send_alert(ssl, SSL3_AL_FATAL, SSL_AD_PROTOCOL_VERSION);
      return ssl_hs_error;
    }

    hs->state = state_tls13;
    return ssl_hs_ok;
  }

  // If this client is configured to use a PAKE, then the server must support
  // TLS 1.3.
  if (hs->pake_prover) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_UNSUPPORTED_PROTOCOL);
    ssl_send_alert(ssl, SSL3_AL_FATAL, SSL_AD_PROTOCOL_VERSION);
    return ssl_hs_error;
  }

  // Clear some TLS 1.3 state that no longer needs to be retained.
  hs->key_shares[0].reset();
  hs->key_shares[1].reset();
  ssl_done_writing_client_hello(hs);

  // TLS 1.2 handshakes cannot accept ECH.
  if (hs->selected_ech_config) {
    ssl->s3->ech_status = ssl_ech_rejected;
  }

  // Copy over the server random.
  OPENSSL_memcpy(ssl->s3->server_random, CBS_data(&server_hello.random),
                 SSL3_RANDOM_SIZE);

  // Enforce the TLS 1.3 anti-downgrade feature.
  if (!ssl->s3->initial_handshake_complete &&
      hs->max_version >= TLS1_3_VERSION) {
    static_assert(
        sizeof(kTLS12DowngradeRandom) == sizeof(kTLS13DowngradeRandom),
        "downgrade signals have different size");
    static_assert(
        sizeof(kJDK11DowngradeRandom) == sizeof(kTLS13DowngradeRandom),
        "downgrade signals have different size");
    auto suffix =
        Span(ssl->s3->server_random).last(sizeof(kTLS13DowngradeRandom));
    if (suffix == kTLS12DowngradeRandom || suffix == kTLS13DowngradeRandom ||
        suffix == kJDK11DowngradeRandom) {
      OPENSSL_PUT_ERROR(SSL, SSL_R_TLS13_DOWNGRADE);
      ssl_send_alert(ssl, SSL3_AL_FATAL, SSL_AD_ILLEGAL_PARAMETER);
      return ssl_hs_error;
    }
  }

  // The cipher must be allowed in the selected version and enabled.
  const SSL_CIPHER *cipher = SSL_get_cipher_by_value(server_hello.cipher_suite);
  uint32_t mask_a, mask_k;
  ssl_get_client_disabled(hs, &mask_a, &mask_k);
  if (cipher == nullptr ||                                               //
      (cipher->algorithm_mkey & mask_k) ||                               //
      (cipher->algorithm_auth & mask_a) ||                               //
      SSL_CIPHER_get_min_version(cipher) > ssl_protocol_version(ssl) ||  //
      SSL_CIPHER_get_max_version(cipher) < ssl_protocol_version(ssl) ||  //
      !sk_SSL_CIPHER_find(SSL_get_ciphers(ssl), nullptr, cipher)) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_WRONG_CIPHER_RETURNED);
    ssl_send_alert(ssl, SSL3_AL_FATAL, SSL_AD_ILLEGAL_PARAMETER);
    return ssl_hs_error;
  }

  hs->new_cipher = cipher;

  if (!hs->session_id.empty() &&
      Span<const uint8_t>(server_hello.session_id) == hs->session_id) {
    // Echoing the ClientHello session ID in TLS 1.2, whether from the session
    // or a synthetic one, indicates resumption. If there was no session (or if
    // the session was only offered in ECH ClientHelloInner), this was the
    // TLS 1.3 compatibility mode session ID. As we know this is not a session
    // the server knows about, any server resuming it is in error. Reject the
    // first connection deterministicly, rather than installing an invalid
    // session into the session cache. https://crbug.com/796910
    if (ssl->session == nullptr || ssl->s3->ech_status == ssl_ech_rejected) {
      OPENSSL_PUT_ERROR(SSL, SSL_R_SERVER_ECHOED_INVALID_SESSION_ID);
      ssl_send_alert(ssl, SSL3_AL_FATAL, SSL_AD_ILLEGAL_PARAMETER);
      return ssl_hs_error;
    }
    if (ssl->session->ssl_version != ssl->s3->version) {
      OPENSSL_PUT_ERROR(SSL, SSL_R_OLD_SESSION_VERSION_NOT_RETURNED);
      ssl_send_alert(ssl, SSL3_AL_FATAL, SSL_AD_ILLEGAL_PARAMETER);
      return ssl_hs_error;
    }
    if (ssl->session->cipher != hs->new_cipher) {
      OPENSSL_PUT_ERROR(SSL, SSL_R_OLD_SESSION_CIPHER_NOT_RETURNED);
      ssl_send_alert(ssl, SSL3_AL_FATAL, SSL_AD_ILLEGAL_PARAMETER);
      return ssl_hs_error;
    }
    if (!ssl_session_is_context_valid(hs, ssl->session.get())) {
      // This is actually a client application bug.
      OPENSSL_PUT_ERROR(SSL,
                        SSL_R_ATTEMPT_TO_REUSE_SESSION_IN_DIFFERENT_CONTEXT);
      ssl_send_alert(ssl, SSL3_AL_FATAL, SSL_AD_ILLEGAL_PARAMETER);
      return ssl_hs_error;
    }
    // We never offer sessions on renegotiation.
    assert(!ssl->s3->initial_handshake_complete);
    ssl->s3->session_reused = true;
  } else {
    // The session wasn't resumed. Create a fresh SSL_SESSION to fill out.
    ssl_set_session(ssl, NULL);
    if (!ssl_get_new_session(hs)) {
      ssl_send_alert(ssl, SSL3_AL_FATAL, SSL_AD_INTERNAL_ERROR);
      return ssl_hs_error;
    }

    // Save the session ID from the server. This may be empty if the session
    // isn't resumable, or if we'll receive a session ticket later. The
    // ServerHello parser ensures |server_hello.session_id| is within bounds.
    hs->new_session->session_id.CopyFrom(server_hello.session_id);
    hs->new_session->cipher = hs->new_cipher;
  }

  // Now that the cipher is known, initialize the handshake hash and hash the
  // ServerHello.
  if (!hs->transcript.InitHash(ssl_protocol_version(ssl), hs->new_cipher) ||
      !ssl_hash_message(hs, msg)) {
    ssl_send_alert(ssl, SSL3_AL_FATAL, SSL_AD_INTERNAL_ERROR);
    return ssl_hs_error;
  }

  // If doing a full handshake, the server may request a client certificate
  // which requires hashing the handshake transcript. Otherwise, the handshake
  // buffer may be released.
  if (ssl->session != NULL ||
      !ssl_cipher_uses_certificate_auth(hs->new_cipher)) {
    hs->transcript.FreeBuffer();
  }

  // Only the NULL compression algorithm is supported.
  if (server_hello.compression_method != 0) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_UNSUPPORTED_COMPRESSION_ALGORITHM);
    ssl_send_alert(ssl, SSL3_AL_FATAL, SSL_AD_ILLEGAL_PARAMETER);
    return ssl_hs_error;
  }

  if (!ssl_parse_serverhello_tlsext(hs, &server_hello.extensions)) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_PARSE_TLSEXT);
    return ssl_hs_error;
  }

  if (ssl->session != NULL &&
      hs->extended_master_secret != ssl->session->extended_master_secret) {
    if (ssl->session->extended_master_secret) {
      OPENSSL_PUT_ERROR(SSL, SSL_R_RESUMED_EMS_SESSION_WITHOUT_EMS_EXTENSION);
    } else {
      OPENSSL_PUT_ERROR(SSL, SSL_R_RESUMED_NON_EMS_SESSION_WITH_EMS_EXTENSION);
    }
    ssl_send_alert(ssl, SSL3_AL_FATAL, SSL_AD_HANDSHAKE_FAILURE);
    return ssl_hs_error;
  }

  ssl->method->next_message(ssl);

  if (ssl->session != NULL) {
    if (ssl->ctx->reverify_on_resume &&
        ssl_cipher_uses_certificate_auth(hs->new_cipher)) {
      hs->state = state_reverify_server_certificate;
    } else {
      hs->state = state_read_session_ticket;
    }
    return ssl_hs_ok;
  }

  hs->state = state_read_server_certificate;
  return ssl_hs_ok;
}